

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
::IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>::IteratorImpl
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this,
          ParamGeneratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          *base,tuple<testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                *generators,bool is_end)

{
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  _Var1;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  _Var2;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  _Var3;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  _Var4;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  _Var5;
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  *ptVar6;
  ParamIterator<unsigned_int> local_50;
  ParamIterator<unsigned_short> local_48;
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  *local_40;
  ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  (this->
  super_ParamIteratorInterface<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00408320;
  this->base_ = base;
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
  _M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          ).super__Head_base<0UL,_testing::internal::ParamGenerator<unsigned_short>,_false>.
          _M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
  _M_head_impl._4_4_ = extraout_var;
  local_48.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                  )(unique_ptr<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                    )_Var1._M_t.
                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                     .
                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
                     ._M_head_impl;
  _Var2._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          ).
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          .super__Head_base<1UL,_testing::internal::ParamGenerator<unsigned_int>,_false>.
          _M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  _Var2._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl._4_4_ = extraout_var_00;
  local_50.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                  )(unique_ptr<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                    )_Var2._M_t.
                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                     .
                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                     ._M_head_impl;
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       (tuple<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        )(**(code **)(**(long **)&(generators->
                                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                  .
                                  super__Tuple_impl<2UL,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                  .
                                  super__Head_base<2UL,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                                  ._M_head_impl.impl_.
                                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_(__gnu_cxx::_Lock_policy)2>
                     + 0x10))();
  local_40 = &this->begin_;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        )(unique_ptr<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
           ._M_head_impl;
  std::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_true,_true>
            (local_40,&local_48,&local_50,&local_38);
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
                          ._M_head_impl + 8))
              (_Var3._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
               ._M_head_impl);
  }
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )_Var2._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
               ._M_head_impl);
  }
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
                          ._M_head_impl + 8))
              (_Var1._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
               ._M_head_impl);
  }
  _Var4._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
  _M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          ).super__Head_base<0UL,_testing::internal::ParamGenerator<unsigned_short>,_false>.
          _M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  _Var4._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
  _M_head_impl._4_4_ = extraout_var_01;
  local_48.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                  )(unique_ptr<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                    )_Var4._M_t.
                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                     .
                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
                     ._M_head_impl;
  _Var5._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          ).
          super__Tuple_impl<1UL,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
          .super__Head_base<1UL,_testing::internal::ParamGenerator<unsigned_int>,_false>.
          _M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  _Var5._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl._4_4_ = extraout_var_02;
  local_50.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                  )(unique_ptr<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                    )_Var5._M_t.
                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                     .
                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                     ._M_head_impl;
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       (tuple<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        )(**(code **)(**(long **)&(generators->
                                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<unsigned_short>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                  .
                                  super__Tuple_impl<2UL,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                  .
                                  super__Head_base<2UL,_testing::internal::ParamGenerator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                                  ._M_head_impl.impl_.
                                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_(__gnu_cxx::_Lock_policy)2>
                     + 0x18))();
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        )(unique_ptr<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
           ._M_head_impl;
  std::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_true,_true>
            (&this->end_,&local_48,&local_50,&local_38);
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )_Var3._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var3._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
                          ._M_head_impl + 8))
              (_Var3._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
               ._M_head_impl);
  }
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )_Var5._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var5._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))
              (_Var5._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
               ._M_head_impl);
  }
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
       )_Var4._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var4._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
                          ._M_head_impl + 8))
              (_Var4._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
               ._M_head_impl);
  }
  ptVar6 = local_40;
  if (is_end) {
    ptVar6 = &this->end_;
  }
  std::
  tuple<testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  ::tuple(&this->current_,ptVar6);
  (this->current_value_).
  super___shared_ptr<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }